

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O2

int decode_new_session_ticket
              (ptls_t *tls,uint32_t *lifetime,uint32_t *age_add,ptls_iovec_t *nonce,
              ptls_iovec_t *ticket,uint32_t *max_early_data_size,uint8_t *src,uint8_t *end)

{
  st_ptls_on_extension_t *psVar1;
  uint8_t *end_00;
  ushort uVar2;
  int iVar3;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  ushort *puVar7;
  ushort uVar8;
  uint8_t *puVar9;
  ushort *puVar10;
  ushort *puVar11;
  ptls_iovec_t pVar12;
  st_ptls_extension_bitmap_t local_38;
  
  end_00 = end;
  iVar3 = ptls_decode32(lifetime,&src,end);
  if (((iVar3 == 0) && (iVar3 = ptls_decode32(age_add,&src,end_00), iVar3 == 0)) &&
     (iVar3 = 0x32, src != end_00)) {
    uVar4 = (ulong)*src;
    puVar9 = src + 1;
    if (uVar4 <= (ulong)((long)end_00 - (long)puVar9)) {
      nonce->base = puVar9;
      puVar10 = (ushort *)(puVar9 + uVar4);
      nonce->len = uVar4;
      if (1 < (ulong)((long)end_00 - (long)puVar10)) {
        uVar4 = (ulong)(ushort)(*puVar10 << 8 | *puVar10 >> 8);
        puVar7 = puVar10 + 1;
        if (uVar4 - 1 < (ulong)((long)end_00 - (long)puVar7)) {
          lVar5 = (long)puVar10 + uVar4 + 2;
          ticket->base = (uint8_t *)puVar7;
          ticket->len = lVar5 - (long)puVar7;
          *max_early_data_size = 0;
          builtin_memcpy(local_38.bits,"!$\x01",4);
          local_38.bits[4] = '\0';
          local_38.bits[5] = ':';
          local_38.bits[6] = '\b';
          local_38.bits[7] = '\0';
          if (1 < (ulong)((long)end_00 - lVar5)) {
            uVar8 = *(ushort *)((long)puVar10 + uVar4 + 2);
            uVar6 = (ulong)(ushort)(uVar8 << 8 | uVar8 >> 8);
            puVar10 = (ushort *)((long)puVar10 + uVar4 + 4);
            if (uVar6 <= (ulong)((long)end_00 - (long)puVar10)) {
              puVar7 = (ushort *)(uVar6 + (long)puVar10);
              while( true ) {
                if (puVar10 == puVar7) {
                  if (puVar7 != (ushort *)end_00) {
                    return 0x32;
                  }
                  return 0;
                }
                if ((long)puVar7 - (long)puVar10 < 2) {
                  return 0x32;
                }
                uVar8 = *puVar10 << 8 | *puVar10 >> 8;
                if ((uVar8 < 0x40) && ((local_38.bits[uVar8 >> 3] >> (uVar8 & 7) & 1) != 0)) break;
                src = (uint8_t *)(puVar10 + 1);
                extension_bitmap_set(&local_38,uVar8);
                if ((ulong)((long)puVar7 - (long)(puVar10 + 1)) < 2) {
                  return 0x32;
                }
                uVar2 = puVar10[1] << 8 | puVar10[1] >> 8;
                puVar11 = puVar10 + 2;
                if ((ulong)((long)puVar7 - (long)puVar11) < (ulong)uVar2) {
                  return 0x32;
                }
                psVar1 = tls->ctx->on_extension;
                src = (uint8_t *)puVar11;
                if ((psVar1 != (st_ptls_on_extension_t *)0x0) &&
                   (pVar12.len._0_2_ = uVar2, pVar12.base = (uint8_t *)puVar11, pVar12.len._2_6_ = 0
                   , iVar3 = (*psVar1->cb)(psVar1,tls,'\x04',uVar8,pVar12), iVar3 != 0)) {
                  return 1;
                }
                puVar11 = (ushort *)((long)puVar11 + (ulong)uVar2);
                puVar10 = puVar11;
                if ((uVar8 == 0x2a) &&
                   (iVar3 = ptls_decode32(max_early_data_size,&src,(uint8_t *)puVar11),
                   puVar10 = (ushort *)src, iVar3 != 0)) {
                  return iVar3;
                }
                if (puVar10 != puVar11) {
                  return 0x32;
                }
              }
              iVar3 = 0x2f;
            }
          }
        }
      }
    }
  }
  return iVar3;
}

Assistant:

static int decode_new_session_ticket(ptls_t *tls, uint32_t *lifetime, uint32_t *age_add, ptls_iovec_t *nonce, ptls_iovec_t *ticket,
                                     uint32_t *max_early_data_size, const uint8_t *src, const uint8_t *const end)
{
    uint16_t exttype;
    int ret;

    if ((ret = ptls_decode32(lifetime, &src, end)) != 0)
        goto Exit;
    if ((ret = ptls_decode32(age_add, &src, end)) != 0)
        goto Exit;
    ptls_decode_open_block(src, end, 1, {
        *nonce = ptls_iovec_init(src, end - src);
        src = end;
    });
    ptls_decode_open_block(src, end, 2, {
        if (src == end) {
            ret = PTLS_ALERT_DECODE_ERROR;
            goto Exit;
        }
        *ticket = ptls_iovec_init(src, end - src);
        src = end;
    });

    *max_early_data_size = 0;
    decode_extensions(src, end, PTLS_HANDSHAKE_TYPE_NEW_SESSION_TICKET, &exttype, {
        if (tls->ctx->on_extension != NULL &&
            (ret = tls->ctx->on_extension->cb(tls->ctx->on_extension, tls, PTLS_HANDSHAKE_TYPE_NEW_SESSION_TICKET, exttype,
                                              ptls_iovec_init(src, end - src)) != 0))
            goto Exit;
        switch (exttype) {
        case PTLS_EXTENSION_TYPE_EARLY_DATA:
            if ((ret = ptls_decode32(max_early_data_size, &src, end)) != 0)
                goto Exit;
            break;
        default:
            src = end;
            break;
        }
    });

    ret = 0;
Exit:
    return ret;
}